

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  ostream *poVar4;
  stringstream out;
  string local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_1f8.field_2;
  pcVar2 = (sub->description_)._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + (sub->description_)._M_string_length);
  sVar3 = local_1f8._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 == 0) {
    pcVar2 = (sub->name_)._M_dataplus._M_p;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + (sub->name_)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  }
  else {
    pcVar2 = (sub->name_)._M_dataplus._M_p;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + (sub->name_)._M_string_length);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    pcVar2 = (sub->description_)._M_dataplus._M_p;
    local_1d8 = local_1c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar2,pcVar2 + (sub->description_)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1d8,local_1d0);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  make_groups_abi_cxx11_(&local_1f8,this,sub,Sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    if(sub->get_description().empty())
        out << sub->get_name();
    else
        out << sub->get_name() << " -> " << sub->get_description();
    out << make_groups(sub, AppFormatMode::Sub);
    return out.str();
}